

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O3

Adj * Omega_h::find_coarsen_domains
                (Adj *__return_storage_ptr__,Mesh *mesh,LOs *keys2verts,Int ent_dim,
                Read<signed_char> *ents_are_dead)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  Alloc *this;
  Alloc *this_00;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  LOs lke2ke;
  LOs k2lke;
  Write<int> lke2e;
  Write<signed_char> lke_codes;
  Write<int> lke2k;
  Write<signed_char> kes_are_live;
  Read<signed_char> ents_are_live;
  LOs ke2k;
  Read<signed_char> ke_codes;
  LOs ke2e;
  LOs k2ke;
  Adj k2e;
  Adj v2e;
  Alloc *local_2d8;
  void *local_2d0;
  Omega_h *local_2c8;
  Omega_h *local_2c0;
  Adj *local_2b8;
  void *local_2b0;
  LOs local_2a8;
  LOs local_298;
  LOs local_288;
  LOs local_278;
  LOs local_268;
  LOs local_258;
  Write<signed_char> local_248;
  Write<int> local_238;
  Write<int> local_228;
  Alloc *local_218;
  void *local_210;
  Read<int> local_208;
  Alloc *local_1f8;
  void *local_1f0;
  Read<signed_char> local_1e8;
  Alloc *local_1d8;
  void *local_1d0;
  Read<int> local_1c8;
  Alloc *local_1b8;
  void *local_1b0;
  Write<signed_char> local_1a8;
  Read<signed_char> local_198;
  Alloc *local_188;
  void *local_180;
  void *local_178;
  Read<signed_char> local_170;
  Read<signed_char> local_160;
  Read<signed_char> local_150;
  Read<signed_char> local_140;
  Read<signed_char> local_130;
  Alloc *local_120;
  void *local_118;
  LOs local_110;
  Alloc *local_100;
  void *local_f8;
  Alloc *local_f0;
  void *local_e8;
  Alloc *local_e0;
  void *local_d8;
  Alloc *local_d0;
  void *local_c8;
  Adj local_c0;
  Adj local_90;
  Adj local_60;
  
  pAVar2 = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar4 = pAVar2->size;
  }
  else {
    sVar4 = (ulong)pAVar2 >> 3;
  }
  local_2b8 = __return_storage_ptr__;
  Mesh::ask_up(&local_60,mesh,0,ent_dim);
  local_258.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
      local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258.write_.shared_alloc_.alloc =
           (Alloc *)((local_258.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_258.write_.shared_alloc_.alloc)->use_count =
           (local_258.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_258.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
  local_c0.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_c0.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_c0.codes.write_.shared_alloc_.alloc = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.codes.write_.shared_alloc_.alloc)->use_count =
           (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.codes.write_.shared_alloc_.direct_ptr = local_60.codes.write_.shared_alloc_.direct_ptr;
  unmap_adjacency(&local_90,&local_258,&local_c0);
  Adj::~Adj(&local_c0);
  pAVar2 = local_258.write_.shared_alloc_.alloc;
  if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
      local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_258.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_258.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_d0 = local_90.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_90.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)((local_90.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_90.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar2 = local_d0;
  local_c8 = local_90.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_e0 = local_90.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_90.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)((local_90.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_90.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_00 = local_e0;
  local_2b0 = local_90.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_d8 = local_90.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_f0 = local_90.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_90.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0 = (Alloc *)((local_90.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.codes.write_.shared_alloc_.alloc)->use_count =
           (local_90.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this = local_f0;
  local_178 = local_90.codes.write_.shared_alloc_.direct_ptr;
  local_e8 = local_90.codes.write_.shared_alloc_.direct_ptr;
  bVar5 = local_d0 != (Alloc *)0x0;
  bVar6 = ((ulong)local_d0 & 7) == 0;
  local_110.write_.shared_alloc_.alloc = local_d0;
  if (bVar6 && bVar5) {
    if (entering_parallel == '\x01') {
      local_110.write_.shared_alloc_.alloc = (Alloc *)(local_d0->size * 8 + 1);
    }
    else {
      local_d0->use_count = local_d0->use_count + 1;
    }
  }
  local_110.write_.shared_alloc_.direct_ptr =
       local_90.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_2c0 = (Omega_h *)&local_100;
  invert_fan(local_2c0,&local_110);
  pAVar3 = local_110.write_.shared_alloc_.alloc;
  if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
      local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_110.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_110.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_130.write_.shared_alloc_.alloc = (ents_are_dead->write_).shared_alloc_.alloc;
  if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
      local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130.write_.shared_alloc_.alloc =
           (Alloc *)((local_130.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_130.write_.shared_alloc_.alloc)->use_count =
           (local_130.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_130.write_.shared_alloc_.direct_ptr = (ents_are_dead->write_).shared_alloc_.direct_ptr;
  invert_marks((Omega_h *)&local_120,&local_130);
  pAVar3 = local_130.write_.shared_alloc_.alloc;
  if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
      local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_130.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  bVar7 = this_00 != (Alloc *)0x0;
  bVar8 = ((ulong)this_00 & 7) == 0;
  local_268.write_.shared_alloc_.alloc = this_00;
  if (bVar8 && bVar7) {
    if (entering_parallel == '\x01') {
      local_268.write_.shared_alloc_.alloc = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_268.write_.shared_alloc_.direct_ptr = local_2b0;
  local_198.write_.shared_alloc_.alloc = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198.write_.shared_alloc_.alloc = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_198.write_.shared_alloc_.direct_ptr = local_118;
  local_2c8 = (Omega_h *)&local_120;
  unmap<signed_char>((Omega_h *)&local_188,&local_268,&local_198,1);
  pAVar3 = local_198.write_.shared_alloc_.alloc;
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_268.write_.shared_alloc_.alloc;
  if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
      local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_1a8.shared_alloc_.alloc = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.shared_alloc_.alloc = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_1a8.shared_alloc_.direct_ptr = local_180;
  Read<signed_char>::Read(&local_140,&local_1a8);
  collect_marked((Omega_h *)&local_2d8,&local_140);
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
      operator_delete(local_140.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_1a8.shared_alloc_.alloc;
  if (((ulong)local_1a8.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1a8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_278.write_.shared_alloc_.alloc = local_2d8;
  if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_278.write_.shared_alloc_.alloc = (Alloc *)(local_2d8->size * 8 + 1);
    }
    else {
      local_2d8->use_count = local_2d8->use_count + 1;
    }
  }
  local_278.write_.shared_alloc_.direct_ptr = local_2d0;
  local_1c8.write_.shared_alloc_.alloc = local_100;
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
    }
    else {
      local_100->use_count = local_100->use_count + 1;
    }
  }
  local_1c8.write_.shared_alloc_.direct_ptr = local_f8;
  unmap<int>((Omega_h *)&local_1b8,&local_278,&local_1c8,1);
  pAVar3 = local_1c8.write_.shared_alloc_.alloc;
  if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_278.write_.shared_alloc_.alloc;
  if (((ulong)local_278.write_.shared_alloc_.alloc & 7) == 0 &&
      local_278.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_278.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_278.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_288.write_.shared_alloc_.alloc = local_2d8;
  if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288.write_.shared_alloc_.alloc = (Alloc *)(local_2d8->size * 8 + 1);
    }
    else {
      local_2d8->use_count = local_2d8->use_count + 1;
    }
  }
  local_288.write_.shared_alloc_.direct_ptr = local_2d0;
  bVar9 = ((ulong)this & 7) == 0;
  local_1e8.write_.shared_alloc_.alloc = this;
  if (bVar9 && this != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
    }
    else {
      this->use_count = this->use_count + 1;
    }
  }
  local_1e8.write_.shared_alloc_.direct_ptr = local_178;
  unmap<signed_char>((Omega_h *)&local_1d8,&local_288,&local_1e8,1);
  pAVar3 = local_1e8.write_.shared_alloc_.alloc;
  if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1e8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_288.write_.shared_alloc_.alloc;
  if (((ulong)local_288.write_.shared_alloc_.alloc & 7) == 0 &&
      local_288.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_288.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_288.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_298.write_.shared_alloc_.alloc = local_2d8;
  if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_298.write_.shared_alloc_.alloc = (Alloc *)(local_2d8->size * 8 + 1);
    }
    else {
      local_2d8->use_count = local_2d8->use_count + 1;
    }
  }
  local_298.write_.shared_alloc_.direct_ptr = local_2d0;
  local_208.write_.shared_alloc_.alloc = this_00;
  if (bVar8 && bVar7) {
    if (entering_parallel == '\x01') {
      local_208.write_.shared_alloc_.alloc = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_208.write_.shared_alloc_.direct_ptr = local_2b0;
  unmap<int>((Omega_h *)&local_1f8,&local_298,&local_208,1);
  pAVar3 = local_208.write_.shared_alloc_.alloc;
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_208.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_298.write_.shared_alloc_.alloc;
  if (((ulong)local_298.write_.shared_alloc_.alloc & 7) == 0 &&
      local_298.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_298.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_228.shared_alloc_.alloc = local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228.shared_alloc_.alloc = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_228.shared_alloc_.direct_ptr = local_1b0;
  Read<int>::Read(&local_150,&local_228);
  invert_funnel((Omega_h *)&local_218,(LOs *)&local_150,(LO)(sVar4 >> 2));
  if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
      local_150.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_150.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_150.write_.shared_alloc_.alloc);
      operator_delete(local_150.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_228.shared_alloc_.alloc;
  if (((ulong)local_228.shared_alloc_.alloc & 7) == 0 &&
      local_228.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_228.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_228.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_2a8.write_.shared_alloc_.alloc = local_218;
  if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.write_.shared_alloc_.alloc = (Alloc *)(local_218->size * 8 + 1);
    }
    else {
      local_218->use_count = local_218->use_count + 1;
    }
  }
  local_2a8.write_.shared_alloc_.direct_ptr = local_210;
  local_238.shared_alloc_.alloc = local_1f8;
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_238.shared_alloc_.alloc = (Alloc *)(local_1f8->size * 8 + 1);
    }
    else {
      local_1f8->use_count = local_1f8->use_count + 1;
    }
  }
  local_238.shared_alloc_.direct_ptr = local_1f0;
  Read<int>::Read(&local_160,&local_238);
  local_248.shared_alloc_.alloc = local_1d8;
  if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.shared_alloc_.alloc = (Alloc *)(local_1d8->size * 8 + 1);
    }
    else {
      local_1d8->use_count = local_1d8->use_count + 1;
    }
  }
  local_248.shared_alloc_.direct_ptr = local_1d0;
  Read<signed_char>::Read(&local_170,&local_248);
  Adj::Adj(local_2b8,&local_2a8,(LOs *)&local_160,&local_170);
  if (((ulong)local_170.write_.shared_alloc_.alloc & 7) == 0 &&
      local_170.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_170.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_170.write_.shared_alloc_.alloc);
      operator_delete(local_170.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_248.shared_alloc_.alloc;
  if (((ulong)local_248.shared_alloc_.alloc & 7) == 0 &&
      local_248.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_248.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_248.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
      local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_160.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
      operator_delete(local_160.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_238.shared_alloc_.alloc;
  if (((ulong)local_238.shared_alloc_.alloc & 7) == 0 &&
      local_238.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_238.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_238.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_2a8.write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
    piVar1 = &local_218->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_218);
      operator_delete(local_218,0x48);
    }
  }
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    piVar1 = &local_1f8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f8);
      operator_delete(local_1f8,0x48);
    }
  }
  if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
    piVar1 = &local_1d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1d8);
      operator_delete(local_1d8,0x48);
    }
  }
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    piVar1 = &local_1b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8);
      operator_delete(local_1b8,0x48);
    }
  }
  if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
    piVar1 = &local_2d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2d8);
      operator_delete(local_2d8,0x48);
    }
  }
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    piVar1 = &local_188->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188);
      operator_delete(local_188,0x48);
    }
  }
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    piVar1 = &local_120->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120);
      operator_delete(local_120,0x48);
    }
  }
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    piVar1 = &local_100->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_100);
      operator_delete(local_100,0x48);
    }
  }
  if (bVar9 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  if (bVar8 && bVar7) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  if (bVar6 && bVar5) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  Adj::~Adj(&local_90);
  Adj::~Adj(&local_60);
  return local_2b8;
}

Assistant:

Adj find_coarsen_domains(
    Mesh* mesh, LOs keys2verts, Int ent_dim, Read<I8> ents_are_dead) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, ent_dim);
  auto k2e = unmap_adjacency(keys2verts, v2e);
  auto k2ke = k2e.a2ab;
  auto ke2e = k2e.ab2b;
  auto ke_codes = k2e.codes;
  auto ke2k = invert_fan(k2ke);
  auto ents_are_live = invert_marks(ents_are_dead);
  auto kes_are_live = unmap(ke2e, ents_are_live, 1);
  auto lke2ke = collect_marked(kes_are_live);
  auto lke2k = unmap(lke2ke, ke2k, 1);
  auto lke_codes = unmap(lke2ke, ke_codes, 1);
  auto lke2e = unmap(lke2ke, ke2e, 1);
  auto k2lke = invert_funnel(lke2k, nkeys);
  return Adj(k2lke, lke2e, lke_codes);
}